

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  item[0].valuedouble = 0.0;
  item[0].string = (char *)0x0;
  item[0].valuestring = (char *)0x0;
  item[0].valueint = 0;
  item[0]._44_4_ = 0;
  item[0].child = (cJSON *)0x0;
  item[0].type = 0;
  item[0]._28_4_ = 0;
  item[0].next = (cJSON *)0x0;
  item[0].prev = (cJSON *)0x0;
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/icsiii[P]embedded-abstract-message/vendor/cJSON/tests/parse_number.c"
            );
  UnityDefaultTestRun(parse_number_should_parse_zero,"parse_number_should_parse_zero",0x68);
  UnityDefaultTestRun(parse_number_should_parse_negative_integers,
                      "parse_number_should_parse_negative_integers",0x69);
  UnityDefaultTestRun(parse_number_should_parse_positive_integers,
                      "parse_number_should_parse_positive_integers",0x6a);
  UnityDefaultTestRun(parse_number_should_parse_positive_reals,
                      "parse_number_should_parse_positive_reals",0x6b);
  UnityDefaultTestRun(parse_number_should_parse_negative_reals,
                      "parse_number_should_parse_negative_reals",0x6c);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
    /* initialize cJSON item */
    memset(item, 0, sizeof(cJSON));
    UNITY_BEGIN();
    RUN_TEST(parse_number_should_parse_zero);
    RUN_TEST(parse_number_should_parse_negative_integers);
    RUN_TEST(parse_number_should_parse_positive_integers);
    RUN_TEST(parse_number_should_parse_positive_reals);
    RUN_TEST(parse_number_should_parse_negative_reals);
    return UNITY_END();
}